

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

void __thiscall DataRefs::ForceDataReload(DataRefs *this)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = dataRefs.bShowingAircraft;
  if (1 < (int)this->pluginState) {
    LTMainHideAircraft();
    dataRefs.bShowingAircraft = 0;
    MenuUpdateAllItemStatus();
    LTMainDisable();
    bVar2 = LTMainEnable();
    if (bVar2) {
      SetAircraftDisplayed(&dataRefs,(uint)(iVar1 != 0));
      return;
    }
  }
  return;
}

Assistant:

void DataRefs::ForceDataReload ()
{
    // if we change this setting while running
    // we 'simulate' a re-initialization
    if (pluginState >= STATE_ENABLED) {
        // remove all existing aircraft
        bool bShowAc = dataRefs.AreAircraftDisplayed();
        dataRefs.SetAircraftDisplayed(false);

        // disable myself / stop all connections
        LTMainDisable();
        
        // create the connections to flight data
        if ( LTMainEnable() ) {
            // display aircraft (if that was the case previously)
            dataRefs.SetAircraftDisplayed(bShowAc);
        }
    }
}